

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_426d84::ArrayType::printRight(ArrayType *this,OutputStream *S)

{
  char cVar1;
  bool bVar2;
  Node *this_00;
  StringView local_58;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  ArrayType *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  cVar1 = OutputStream::back(S);
  if (cVar1 != ']') {
    StringView::StringView(&local_28," ");
    OutputStream::operator+=(local_18,local_28);
  }
  StringView::StringView(&local_38,"[");
  OutputStream::operator+=(local_18,local_38);
  bVar2 = NodeOrString::isString(&this->Dimension);
  if (bVar2) {
    local_48 = NodeOrString::asString(&this->Dimension);
    OutputStream::operator+=(local_18,local_48);
  }
  else {
    bVar2 = NodeOrString::isNode(&this->Dimension);
    if (bVar2) {
      this_00 = NodeOrString::asNode(&this->Dimension);
      Node::print(this_00,local_18);
    }
  }
  StringView::StringView(&local_58,"]");
  OutputStream::operator+=(local_18,local_58);
  (*this->Base->_vptr_Node[5])(this->Base,local_18);
  return;
}

Assistant:

void printRight(OutputStream &S) const override {
    if (S.back() != ']')
      S += " ";
    S += "[";
    if (Dimension.isString())
      S += Dimension.asString();
    else if (Dimension.isNode())
      Dimension.asNode()->print(S);
    S += "]";
    Base->printRight(S);
  }